

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O3

MPP_RET vdpp2_wait(vdpp2_api_ctx *ctx)

{
  int __errnum;
  MPP_RET MVar1;
  int *piVar2;
  char *pcVar3;
  
  MVar1 = ioctl((int)ctx,0x40047601);
  if (MVar1 != MPP_OK) {
    piVar2 = __errno_location();
    __errnum = *piVar2;
    pcVar3 = strerror(__errnum);
    MVar1 = _mpp_log_l(2,"vdpp2","ioctl POLL_HW_FINISH failed ret %d errno %d %s\n","vdpp2_wait",
                       MVar1,__errnum,pcVar3);
  }
  return MVar1;
}

Assistant:

static MPP_RET vdpp2_wait(struct vdpp2_api_ctx *ctx)
{
    MPP_RET ret;
    MppReqV1 mpp_req;

    if (NULL == ctx) {
        mpp_err_f("found NULL input vdpp ctx %p\n", ctx);
        return MPP_ERR_NULL_PTR;
    }

    memset(&mpp_req, 0, sizeof(mpp_req));
    mpp_req.cmd = MPP_CMD_POLL_HW_FINISH;
    mpp_req.flag |= MPP_FLAGS_LAST_MSG;

    ret = (RK_S32)ioctl(ctx->fd, MPP_IOC_CFG_V1, &mpp_req);
    if (ret) {
        mpp_err_f("ioctl POLL_HW_FINISH failed ret %d errno %d %s\n",
                  ret, errno, strerror(errno));
    }

    return ret;
}